

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

VmConstant * AllocateHeapArray(InstructionVMEvalContext *ctx,TypeBase *target,uint count)

{
  uint offset;
  Allocator *pAVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  TypeUnsizedArray *pTVar5;
  ulong *puVar6;
  unsigned_long_long tmp;
  VmConstant *pVVar4;
  undefined4 extraout_var_00;
  
  offset = ctx->heapSize;
  InstructionVMEvalContext::Storage::Reserve(&ctx->heap,ctx,offset,(int)target->size * count);
  uVar2 = (int)target->size * count + ctx->heapSize;
  ctx->heapSize = uVar2;
  if (uVar2 < 0xffff) {
    if (0xffff < offset) {
      __assert_fail("unsigned(pointer & memoryOffsetMask) == pointer",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x285,
                    "VmConstant *AllocateHeapArray(InstructionVMEvalContext &, TypeBase *, unsigned int)"
                   );
    }
    uVar2 = GetStorageIndex(ctx,&ctx->heap);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    pVVar4 = (VmConstant *)CONCAT44(extraout_var,iVar3);
    pAVar1 = ctx->allocator;
    pTVar5 = ExpressionContext::GetUnsizedArrayType(ctx->ctx,target);
    if (pTVar5 == (TypeUnsizedArray *)0x0) {
      __assert_fail("structType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                    ,0xdb,"static const VmType VmType::ArrayRef(TypeBase *)");
    }
    (pVVar4->super_VmValue).typeID = 1;
    (pVVar4->super_VmValue).type.type = VM_TYPE_ARRAY_REF;
    (pVVar4->super_VmValue).type.size = 0xc;
    (pVVar4->super_VmValue).type.structType = (TypeBase *)pTVar5;
    (pVVar4->super_VmValue).source = (SynBase *)0x0;
    (pVVar4->super_VmValue).comment.begin = (char *)0x0;
    (pVVar4->super_VmValue).comment.end = (char *)0x0;
    (pVVar4->super_VmValue).users.allocator = pAVar1;
    (pVVar4->super_VmValue).users.data = (pVVar4->super_VmValue).users.little;
    (pVVar4->super_VmValue).users.count = 0;
    (pVVar4->super_VmValue).users.max = 8;
    (pVVar4->super_VmValue).hasKnownNonSimpleUse = false;
    (pVVar4->super_VmValue).hasSideEffects = false;
    (pVVar4->super_VmValue).hasMemoryAccess = false;
    (pVVar4->super_VmValue).canBeRemoved = true;
    (pVVar4->super_VmValue).hasKnownSimpleUse = false;
    (pVVar4->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00224d48;
    pVVar4->iValue = 0;
    pVVar4->dValue = 0.0;
    pVVar4->lValue = 0;
    pVVar4->sValue = (char *)0x0;
    pVVar4->bValue = (VmBlock *)0x0;
    pVVar4->fValue = (VmFunction *)0x0;
    pVVar4->container = (VariableData *)0x0;
    pVVar4->isFloat = false;
    pVVar4->isReference = false;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xc);
    puVar6 = (ulong *)CONCAT44(extraout_var_00,iVar3);
    *puVar6 = (ulong)(uVar2 << 0x10 | offset);
    *(uint *)(puVar6 + 1) = count;
    pVVar4->sValue = (char *)puVar6;
  }
  else {
    pVVar4 = (VmConstant *)0x0;
    anon_unknown.dwarf_128a7b::Report(ctx,"ERROR: heap limit reached");
  }
  return pVVar4;
}

Assistant:

VmConstant* AllocateHeapArray(InstructionVMEvalContext &ctx, TypeBase *target, unsigned count)
{
	unsigned offset = ctx.heapSize;

	ctx.heap.Reserve(ctx, offset, unsigned(target->size) * count);
	ctx.heapSize += unsigned(target->size) * count;

	if(ctx.heapSize >= memoryOffsetMask)
		return (VmConstant*)Report(ctx, "ERROR: heap limit reached");

	unsigned pointer = 0;

	pointer = offset;
	assert(unsigned(pointer & memoryOffsetMask) == pointer);
	pointer |= GetStorageIndex(ctx, &ctx.heap) << memoryStorageBits;

	VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, VmType::ArrayRef(ctx.ctx.GetUnsizedArrayType(target)), NULL);

	char *storage = (char*)ctx.allocator->alloc(result->type.size);

	if(sizeof(void*) == 4)
	{
		memcpy(storage, &pointer, 4);
	}
	else
	{
		unsigned long long tmp = pointer;
		memcpy(storage, &tmp, 8);
	}

	memcpy(storage + sizeof(void*), &count, 4);

	result->sValue = storage;

	return result;
}